

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_annotation.c
# Opt level: O0

HPDF_Annotation
HPDF_3DAnnot_New(HPDF_MMgr mmgr,HPDF_Xref_conflict xref,HPDF_Rect rect,HPDF_BOOL tb,HPDF_BOOL np,
                HPDF_U3D u3d,HPDF_Image ap)

{
  HPDF_String obj;
  HPDF_Dict p_Var1;
  HPDF_STATUS HVar2;
  HPDF_STATUS HVar3;
  HPDF_STATUS HVar4;
  HPDF_STATUS HVar5;
  HPDF_STATUS HVar6;
  HPDF_Dict obj_00;
  HPDF_STATUS local_70;
  HPDF_STATUS ret;
  HPDF_Dict_conflict stream;
  HPDF_Dict_conflict appearance;
  HPDF_Dict_conflict action;
  HPDF_Annotation annot;
  HPDF_Image ap_local;
  HPDF_U3D u3d_local;
  HPDF_BOOL np_local;
  HPDF_BOOL tb_local;
  HPDF_Xref_conflict xref_local;
  HPDF_MMgr mmgr_local;
  HPDF_Rect rect_local;
  
  rect_local._8_8_ = HPDF_Annotation_New(mmgr,xref,HPDF_ANNOT_3D,rect);
  if ((HPDF_Annotation)rect_local._8_8_ == (HPDF_Annotation)0x0) {
    rect_local.right = 0.0;
    rect_local.top = 0.0;
  }
  else {
    HPDF_Dict_AddNumber((HPDF_Dict)rect_local._8_8_,"F",0x44);
    obj = HPDF_String_New(mmgr,"3D Model",(HPDF_Encoder_conflict)0x0);
    HPDF_Dict_Add((HPDF_Dict)rect_local._8_8_,"Contents",obj);
    p_Var1 = HPDF_Dict_New(mmgr);
    if (p_Var1 == (HPDF_Dict)0x0) {
      rect_local.right = 0.0;
      rect_local.top = 0.0;
    }
    else {
      HVar2 = HPDF_Dict_Add((HPDF_Dict)rect_local._8_8_,"3DA",p_Var1);
      if (HVar2 == 0) {
        HVar2 = HPDF_Dict_AddName(p_Var1,"A","PO");
        HVar3 = HPDF_Dict_AddBoolean(p_Var1,"TB",tb);
        HVar4 = HPDF_Dict_AddBoolean(p_Var1,"NP",np);
        HVar5 = HPDF_Dict_AddName(p_Var1,"DIS","U");
        HVar6 = HPDF_Dict_AddName(p_Var1,"AIS","L");
        if (HVar6 + HVar5 + HVar4 + HVar3 + HVar2 == 0) {
          HVar2 = HPDF_Dict_Add((HPDF_Dict)rect_local._8_8_,"3DD",u3d);
          if (HVar2 == 0) {
            p_Var1 = HPDF_Dict_New(mmgr);
            if (p_Var1 == (HPDF_Dict)0x0) {
              rect_local.right = 0.0;
              rect_local.top = 0.0;
            }
            else {
              HVar2 = HPDF_Dict_Add((HPDF_Dict)rect_local._8_8_,"AP",p_Var1);
              if (HVar2 == 0) {
                if (ap == (HPDF_Image)0x0) {
                  obj_00 = HPDF_Dict_New(mmgr);
                  if (obj_00 == (HPDF_Dict)0x0) {
                    return (HPDF_Annotation)0x0;
                  }
                  local_70 = HPDF_Dict_Add(p_Var1,"N",obj_00);
                }
                else {
                  HVar2 = HPDF_Dict_Add(p_Var1,"N",ap);
                  if (HVar2 != 0) {
                    return (HPDF_Annotation)0x0;
                  }
                  local_70 = 0;
                }
                if (local_70 != 0) {
                  rect_local.right = 0.0;
                  rect_local.top = 0.0;
                }
              }
              else {
                rect_local.right = 0.0;
                rect_local.top = 0.0;
              }
            }
          }
          else {
            rect_local.right = 0.0;
            rect_local.top = 0.0;
          }
        }
        else {
          rect_local.right = 0.0;
          rect_local.top = 0.0;
        }
      }
      else {
        rect_local.right = 0.0;
        rect_local.top = 0.0;
      }
    }
  }
  return (HPDF_Annotation)rect_local._8_8_;
}

Assistant:

HPDF_Annotation
HPDF_3DAnnot_New    (HPDF_MMgr        mmgr,
                     HPDF_Xref        xref,
                     HPDF_Rect        rect,
                     HPDF_BOOL        tb,
                     HPDF_BOOL        np,
                     HPDF_U3D         u3d,
                     HPDF_Image       ap)
{
    HPDF_Annotation annot;
    HPDF_Dict action, appearance, stream;
    HPDF_STATUS ret;

    HPDF_PTRACE((" HPDF_3DAnnot_New\n"));

    annot = HPDF_Annotation_New (mmgr, xref, HPDF_ANNOT_3D, rect);
    if (!annot) {
        return NULL;
    }

    // include the flags
    HPDF_Dict_AddNumber (annot, "F", 68);
    //Bit 3:Print If set, print the annotation when the page is printed.
    //Bit 7:If set, do not allow the annotation to interact with the user.
    //      The annotation may be displayed or printed (depending on the settings of the NoView and Print flags)
    //      but should not respond to mouse clicks or change its appearance in response to mouse motions.

    HPDF_Dict_Add(annot, "Contents", HPDF_String_New (mmgr, "3D Model", NULL));

    action = HPDF_Dict_New (mmgr);
    if (!action) {
        return NULL;
    }

    ret = HPDF_Dict_Add (annot, "3DA", action);
    if (ret != HPDF_OK) {
        return NULL;
    }

    // enable visibility on page open
    ret += HPDF_Dict_AddName (action, "A", "PO");

    // enable visibility of ToolBar
    ret += HPDF_Dict_AddBoolean(action, "TB", tb);

    // enable visibility of Navigation Panel
    ret += HPDF_Dict_AddBoolean(action, "NP", np);

    // Set behavior of Annotation on Disabling
    ret += HPDF_Dict_AddName(action, "DIS", "U");

    // Set behavior of Annotation upon activation
    ret += HPDF_Dict_AddName(action, "AIS", "L");

    if (ret != HPDF_OK) {
        return NULL;
    }

    if (HPDF_Dict_Add (annot, "3DD", u3d) != HPDF_OK) {
        return NULL;
    }

    appearance = HPDF_Dict_New (mmgr);
    if (!appearance) {
        return NULL;
    }

    ret = HPDF_Dict_Add (annot, "AP", appearance);
    if (ret != HPDF_OK) {
        return NULL;
    }

    if (ap) {
        if (HPDF_Dict_Add (appearance, "N", ap) != HPDF_OK)
            return NULL;
    }
    else {
        stream = HPDF_Dict_New (mmgr);
        if (!stream) {
            return NULL;
        }
        ret = HPDF_Dict_Add (appearance, "N", stream);
    }

    if (ret != HPDF_OK) {
        return NULL;
    }

    return annot;
}